

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O1

NamespaceDeclaration * __thiscall
QXmlStreamWriterPrivate::findNamespace
          (QXmlStreamWriterPrivate *this,QAnyStringView namespaceUri,bool writeDeclaration,
          bool noDefault)

{
  qsizetype *pqVar1;
  QString *pQVar2;
  Data *data;
  qsizetype lhs;
  bool bVar3;
  long lVar4;
  NamespaceDeclaration *pNVar5;
  char16_t *pcVar6;
  long lVar7;
  storage_type_conflict *psVar8;
  int n;
  ulong uVar9;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar10;
  NamespaceDeclaration *unaff_R12;
  longlong __tmp;
  XmlStringRef *pXVar11;
  long lVar12;
  char16_t *tmp;
  NamespaceDeclaration *pNVar13;
  long in_FS_OFFSET;
  QStringView rhs;
  QAnyStringView s;
  QAnyStringView lhs_00;
  QArrayData *local_b8;
  QString local_88;
  QStringBuilder<char16_t,_QString> local_70;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pNVar5 = (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.data;
  lVar7 = (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.tos;
  pNVar13 = pNVar5 + lVar7 + 1;
  lVar7 = lVar7 * 0x30;
  do {
    lVar12 = lVar7;
    if (lVar12 == -0x30) break;
    pQVar2 = pNVar13[-1].namespaceUri.m_string;
    if (pQVar2 == (QString *)0x0) {
      aVar10.m_data = (char16_t *)0x0;
    }
    else {
      pcVar6 = (pQVar2->d).ptr;
      if (pcVar6 == (char16_t *)0x0) {
        pcVar6 = L"";
      }
      aVar10.m_data_utf16 = pcVar6 + *(long *)((long)&(pNVar5->namespaceUri).m_pos + lVar12);
    }
    uVar9 = pNVar13[-1].namespaceUri.m_size | 0x8000000000000000;
    if (pQVar2 == (QString *)0x0) {
      uVar9 = 0x8000000000000000;
    }
    lhs_00.m_size = uVar9;
    lhs_00.field_0.m_data = aVar10.m_data;
    bVar3 = QAnyStringView::equal(lhs_00,namespaceUri);
    if ((!bVar3) || ((noDefault && (*(long *)((long)&(pNVar5->prefix).m_size + lVar12) == 0)))) {
      bVar3 = true;
    }
    else {
      bVar3 = false;
      unaff_R12 = (NamespaceDeclaration *)((long)&(pNVar5->prefix).m_string + lVar12);
    }
    pNVar13 = pNVar13 + -1;
    lVar7 = lVar12 + -0x30;
  } while (bVar3);
  if (lVar12 == -0x30) {
    if (((undefined1  [16])namespaceUri & (undefined1  [16])0x3fffffffffffffff) ==
        (undefined1  [16])0x0) {
      unaff_R12 = &this->emptyNamespace;
    }
    else {
      lVar7 = (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.tos;
      lVar12 = (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.cap;
      if (lVar12 <= lVar7 + 1) {
        lVar7 = lVar7 + 2;
        lVar4 = lVar12 * 2;
        if (lVar7 != lVar4 && SBORROW8(lVar7,lVar4) == lVar7 + lVar12 * -2 < 0) {
          lVar4 = lVar7;
        }
        (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.cap = lVar4;
        pNVar5 = (NamespaceDeclaration *)
                 realloc((this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.data,
                         lVar4 * 0x30);
        (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.data = pNVar5;
        if (pNVar5 == (NamespaceDeclaration *)0x0) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            qBadAlloc();
          }
          goto LAB_003a3e47;
        }
      }
      pNVar5 = (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.data;
      lVar7 = (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.tos + 1;
      (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.tos = lVar7;
      psVar8 = (storage_type_conflict *)(lVar7 * 0x30);
      unaff_R12 = pNVar5 + lVar7;
      pqVar1 = &pNVar5[lVar7].namespaceUri.m_pos;
      *pqVar1 = 0;
      pqVar1[1] = 0;
      pqVar1 = &pNVar5[lVar7].prefix.m_size;
      *pqVar1 = 0;
      pqVar1[1] = 0;
      pNVar5[lVar7].prefix.m_string = (QString *)0x0;
      pNVar5[lVar7].prefix.m_pos = 0;
      n = this->namespacePrefixCount + 1;
      this->namespacePrefixCount = n;
      local_b8 = (QArrayData *)0x0;
      pXVar11 = (XmlStringRef *)0x0;
      aVar10.m_data = (void *)0x0;
      do {
        QString::number(&local_88,n,10);
        local_70.b.d.size = local_88.d.size;
        local_70.b.d.ptr = local_88.d.ptr;
        local_70.b.d.d = local_88.d.d;
        local_70.a = L'n';
        local_88.d.d = (Data *)0x0;
        local_88.d.ptr = (char16_t *)0x0;
        local_88.d.size = 0;
        QStringBuilder<char16_t,_QString>::convertTo<QString>(&local_50,&local_70);
        lhs = local_50.d.size;
        pcVar6 = local_50.d.ptr;
        data = local_50.d.d;
        local_50.d.d = (Data *)local_b8;
        local_50.d.ptr = aVar10.m_data_utf16;
        local_50.d.size = (qsizetype)pXVar11;
        if (local_b8 != (QArrayData *)0x0) {
          LOCK();
          (local_b8->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_b8,2,0x10);
          }
        }
        if (&(local_70.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_70.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_70.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
          ;
          UNLOCK();
          if (((local_70.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_70.b.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
          }
        }
        n = n + 1;
        lVar7 = (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.tos;
        lVar12 = lVar7 * 0x30;
        do {
          lVar4 = lVar7;
          if (lVar4 < 1) break;
          rhs.m_data = psVar8;
          rhs.m_size = (qsizetype)pcVar6;
          bVar3 = QtPrivate::operator!=
                            ((QtPrivate *)
                             ((long)&(this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.
                                     data[-1].prefix.m_string + lVar12),(XmlStringRef *)lhs,rhs);
          lVar7 = lVar4 + -1;
          lVar12 = lVar12 + -0x30;
        } while (bVar3);
        local_b8 = &data->super_QArrayData;
        pXVar11 = (XmlStringRef *)lhs;
        aVar10.m_data_utf16 = pcVar6;
      } while (0 < lVar4);
      s.m_size = lhs | 0x8000000000000000;
      s.field_0.m_data = pcVar6;
      QXmlStreamPrivateTagStack::addToStringStorage
                ((XmlStringRef *)&local_70,&this->super_QXmlStreamPrivateTagStack,s);
      (unaff_R12->prefix).m_size = (qsizetype)local_70.b.d.ptr;
      (unaff_R12->prefix).m_string = (QString *)CONCAT62(local_70._2_6_,local_70.a);
      (unaff_R12->prefix).m_pos = (qsizetype)local_70.b.d.d;
      if (&data->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&data->super_QArrayData,2,0x10);
        }
      }
      QXmlStreamPrivateTagStack::addToStringStorage
                ((XmlStringRef *)&local_70,&this->super_QXmlStreamPrivateTagStack,namespaceUri);
      (unaff_R12->namespaceUri).m_size = (qsizetype)local_70.b.d.ptr;
      (unaff_R12->namespaceUri).m_string = (QString *)CONCAT62(local_70._2_6_,local_70.a);
      (unaff_R12->namespaceUri).m_pos = (qsizetype)local_70.b.d.d;
      if (writeDeclaration) {
        writeNamespaceDeclaration(this,unaff_R12);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return unaff_R12;
  }
LAB_003a3e47:
  __stack_chk_fail();
}

Assistant:

QXmlStreamPrivateTagStack::NamespaceDeclaration &QXmlStreamWriterPrivate::findNamespace(QAnyStringView namespaceUri, bool writeDeclaration, bool noDefault)
{
    for (NamespaceDeclaration &namespaceDeclaration : reversed(namespaceDeclarations)) {
        if (namespaceDeclaration.namespaceUri == namespaceUri) {
            if (!noDefault || !namespaceDeclaration.prefix.isEmpty())
                return namespaceDeclaration;
        }
    }
    if (namespaceUri.isEmpty())
        return emptyNamespace;
    NamespaceDeclaration &namespaceDeclaration = namespaceDeclarations.push();
    if (namespaceUri.isEmpty()) {
        namespaceDeclaration.prefix.clear();
    } else {
        QString s;
        int n = ++namespacePrefixCount;
        forever {
            s = u'n' + QString::number(n++);
            qsizetype j = namespaceDeclarations.size() - 2;
            while (j >= 0 && namespaceDeclarations.at(j).prefix != s)
                --j;
            if (j < 0)
                break;
        }
        namespaceDeclaration.prefix = addToStringStorage(s);
    }